

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

AtomicCmpXchgInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::AtomicCmpXchgInst,LLVMBC::Value*&,LLVMBC::Value*&,LLVMBC::Value*&>
          (LLVMContext *this,Value **u,Value **u_1,Value **u_2)

{
  AtomicCmpXchgInst *this_00;
  
  this_00 = (AtomicCmpXchgInst *)allocate(this,0x88,8);
  if (this_00 != (AtomicCmpXchgInst *)0x0) {
    AtomicCmpXchgInst::AtomicCmpXchgInst(this_00,*u,*u_1,*u_2);
    append_typed_destructor<LLVMBC::AtomicCmpXchgInst>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}